

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O3

void __thiscall spvtools::opt::IRContext::AddExtInstImport(IRContext *this,string *name)

{
  ulong uVar1;
  FeatureManager *this_00;
  uint uVar2;
  uint32_t res_id;
  Instruction *this_01;
  uint uVar3;
  size_t byte_index;
  ulong uVar4;
  uint uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ext_words;
  uint32_t word;
  size_type __dnew;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  char *local_a8;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [32];
  unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_58;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_a8 = (char *)((ulong)local_a8 & 0xffffffff00000000);
  uVar1 = name->_M_string_length;
  uVar2 = 0;
  uVar4 = 0;
  do {
    uVar3 = 0;
    if (uVar4 < uVar1) {
      uVar3 = (uint)(byte)(name->_M_dataplus)._M_p[uVar4];
    }
    uVar5 = (uint)uVar4 & 3;
    uVar2 = uVar2 | uVar3 << (char)uVar5 * '\b';
    local_a8 = (char *)CONCAT44(local_a8._4_4_,uVar2);
    if (uVar5 == 3) {
      if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_a8);
      }
      else {
        *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar2;
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_a8 = (char *)((ulong)local_a8 & 0xffffffff00000000);
      uVar2 = 0;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 <= uVar1);
  if (((int)uVar1 + 1U & 3) != 0) {
    if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,
                 (iterator)
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_a8);
    }
    else {
      *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar2;
      local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  this_01 = (Instruction *)operator_new(0x70);
  res_id = Module::TakeNextIdBound
                     ((this->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((res_id == 0) && ((this->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_a8 = local_a0 + 8;
    local_78._0_8_ = (_func_int **)0x25;
    local_a8 = (char *)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)local_78);
    local_a0._8_8_ = local_78._0_8_;
    builtin_strncpy(local_a8,"ID overflow. Try running compact-ids.",0x25);
    local_a0._0_8_ = local_78._0_8_;
    local_a8[local_78._0_8_] = '\0';
    local_78._0_8_ = (_func_int **)0x0;
    local_78._8_8_ = 0;
    local_78._16_4_ = (array<signed_char,_4UL>)0x0;
    local_78._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&this->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_78,local_a8);
    if (local_a8 != local_a0 + 8) {
      operator_delete(local_a8,local_a0._8_8_ + 1);
    }
  }
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)local_78,&local_c8);
  local_a8 = (char *)CONCAT44(local_a8._4_4_,0xb);
  local_a0._0_8_ = &PTR__SmallVector_00930a20;
  local_a0._8_8_ = 0;
  local_a0._24_8_ = local_a0 + 0x10;
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_a0,(SmallVector<unsigned_int,_2UL> *)local_78);
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             &local_a8,local_78);
  Instruction::Instruction(this_01,this,OpExtInstImport,0,res_id,(OperandList *)&local_48);
  AddCombinatorsForExtension(this,this_01);
  if ((this->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::AnalyzeInstDefUse
              ((this->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               this_01);
  }
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((this->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
              ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction>,this_01);
  this_00 = (this->feature_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
            .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  if (this_00 != (FeatureManager *)0x0) {
    FeatureManager::AddExtInstImportIds
              (this_00,(this->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  local_a0._0_8_ = &PTR__SmallVector_00930a20;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_80,local_80._M_head_impl);
  }
  local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_78._0_8_ = &PTR__SmallVector_00930a20;
  if ((tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_58._M_t.
        super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
      (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_58,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_58._M_t.
               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void IRContext::AddExtInstImport(const std::string& name) {
  std::vector<uint32_t> ext_words = spvtools::utils::MakeVector(name);
  AddExtInstImport(std::unique_ptr<Instruction>(
      new Instruction(this, spv::Op::OpExtInstImport, 0u, TakeNextId(),
                      {{SPV_OPERAND_TYPE_LITERAL_STRING, ext_words}})));
}